

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DescriptorPoolManager::DescriptorPoolManager
          (DescriptorPoolManager *this,RenderDeviceVkImpl *DeviceVkImpl,string *PoolName,
          vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *PoolSizes,
          uint32_t MaxSets,bool AllowFreeing)

{
  element_type *peVar1;
  VkDescriptorPoolSize *pVVar2;
  const_iterator __position;
  
  this->m_DeviceVkImpl = DeviceVkImpl;
  std::__cxx11::string::string((string *)&this->m_PoolName,(string *)PoolName);
  peVar1 = (DeviceVkImpl->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __position._M_current =
       (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_start;
  while (pVVar2 = (PoolSizes->
                  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
                  _M_impl.super__Vector_impl_data._M_finish, __position._M_current != pVVar2) {
    if (((__position._M_current)->type == VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR) &&
       ((peVar1->m_EnabledExtFeatures).RayTracingPipeline.rayTracingPipeline == 0)) {
      __position._M_current =
           (VkDescriptorPoolSize *)
           std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::erase
                     (PoolSizes,__position);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_start =
       (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar2;
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_MaxSets = MaxSets;
  this->m_AllowFreeing = AllowFreeing;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::
  _Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::_Deque_base(&(this->m_Pools).
                 super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
               );
  LOCK();
  (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

DescriptorPoolManager::DescriptorPoolManager(RenderDeviceVkImpl&               DeviceVkImpl,
                                             std::string                       PoolName,
                                             std::vector<VkDescriptorPoolSize> PoolSizes,
                                             uint32_t                          MaxSets,
                                             bool                              AllowFreeing) noexcept :
    // clang-format off
    m_DeviceVkImpl{DeviceVkImpl        },
    m_PoolName    {std::move(PoolName) },
    m_PoolSizes   (PrunePoolSizes(DeviceVkImpl, std::move(PoolSizes))),
    m_MaxSets     {MaxSets             },
    m_AllowFreeing{AllowFreeing        }
// clang-format on
{
#ifdef DILIGENT_DEVELOPMENT
    m_AllocatedPoolCounter = 0;
#endif
}